

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicResourceTexture::Run(BasicResourceTexture *this)

{
  bool bVar1;
  Vector<unsigned_int,_3> local_60;
  Vector<unsigned_int,_3> local_54;
  Vector<unsigned_int,_3> local_48;
  Vector<unsigned_int,_3> local_3c;
  Vector<unsigned_int,_3> local_30;
  Vector<unsigned_int,_3> local_24;
  BasicResourceTexture *local_18;
  BasicResourceTexture *this_local;
  
  local_18 = this;
  tcu::Vector<unsigned_int,_3>::Vector(&local_24,4,4,4);
  tcu::Vector<unsigned_int,_3>::Vector(&local_30,8,1,1);
  bVar1 = RunIteration(this,&local_24,&local_30,false);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    tcu::Vector<unsigned_int,_3>::Vector(&local_3c,2,4,2);
    tcu::Vector<unsigned_int,_3>::Vector(&local_48,2,4,1);
    bVar1 = RunIteration(this,&local_3c,&local_48,true);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<unsigned_int,_3>::Vector(&local_54,2,2,2);
      tcu::Vector<unsigned_int,_3>::Vector(&local_60,2,2,2);
      bVar1 = RunIteration(this,&local_54,&local_60,false);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        this_local = (BasicResourceTexture *)0x0;
      }
      else {
        this_local = (BasicResourceTexture *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicResourceTexture *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicResourceTexture *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(4, 4, 4), uvec3(8, 1, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 2), uvec3(2, 4, 1), true))
			return ERROR;
		if (!RunIteration(uvec3(2, 2, 2), uvec3(2, 2, 2), false))
			return ERROR;
		return NO_ERROR;
	}